

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

Vec_Int_t * Ga2_ManAbsTranslate(Ga2_Man_t *p)

{
  Gia_Man_t *p_00;
  int iVar1;
  Vec_Int_t *p_01;
  Gia_Obj_t *pObj;
  int i;
  
  p_01 = Vec_IntStart(p->pGia->nObjs);
  i = 0;
  Vec_IntWriteEntry(p_01,0,1);
  while( true ) {
    if (p->vAbs->nSize <= i) {
      return p_01;
    }
    p_00 = p->pGia;
    iVar1 = Vec_IntEntry(p->vAbs,i);
    pObj = Gia_ManObj(p_00,iVar1);
    if (pObj == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pObj & 0x1fffffff) == 0 || (int)*(uint *)pObj < 0) {
      iVar1 = Gia_ObjIsRo(p->pGia,pObj);
      if (iVar1 == 0) {
        if ((~*(ulong *)pObj & 0x1fffffff1fffffff) != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/abs/absGla.c"
                        ,0x443,"Vec_Int_t *Ga2_ManAbsTranslate(Ga2_Man_t *)");
        }
      }
      else {
        iVar1 = Gia_ObjId(p->pGia,pObj);
        Vec_IntWriteEntry(p_01,iVar1,1);
      }
    }
    else {
      Ga2_ManAbsTranslate_rec(p->pGia,pObj,p_01,1);
    }
    i = i + 1;
  }
  return p_01;
}

Assistant:

Vec_Int_t * Ga2_ManAbsTranslate( Ga2_Man_t * p )
{
    Vec_Int_t * vGateClasses;
    Gia_Obj_t * pObj;
    int i;
    vGateClasses = Vec_IntStart( Gia_ManObjNum(p->pGia) );
    Vec_IntWriteEntry( vGateClasses, 0, 1 );
    Gia_ManForEachObjVec( p->vAbs, p->pGia, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Ga2_ManAbsTranslate_rec( p->pGia, pObj, vGateClasses, 1 );
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
            Vec_IntWriteEntry( vGateClasses, Gia_ObjId(p->pGia, pObj), 1 );
        else if ( !Gia_ObjIsConst0(pObj) )
            assert( 0 );
//        Gia_ObjPrint( p->pGia, pObj );
    }
    return vGateClasses;
}